

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_index.h
# Opt level: O2

void __thiscall S2PointIndex<int>::Iterator::Init(Iterator *this,S2PointIndex<int> *index)

{
  const_iterator cVar1;
  
  this->map_ = &index->map_;
  cVar1 = gtl::internal_btree::
          btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
          ::begin((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                   *)index);
  (this->iter_).node = cVar1.node;
  (this->iter_).position = cVar1.position;
  cVar1 = gtl::internal_btree::
          btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
          ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                 *)this->map_);
  (this->end_).node = cVar1.node;
  (this->end_).position = cVar1.position;
  return;
}

Assistant:

inline void S2PointIndex<Data>::Iterator::Init(
    const S2PointIndex<Data>* index) {
  map_ = &index->map_;
  iter_ = map_->begin();
  end_ = map_->end();
}